

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dwarf_harmless.c
# Opt level: O0

void dwarf_insert_harmless_error(Dwarf_Debug dbg,char *newerror)

{
  uint uVar1;
  char *out;
  size_t inlen;
  char *msgspace;
  uint cur;
  uint next;
  Dwarf_Harmless_s *dhp;
  char *newerror_local;
  Dwarf_Debug dbg_local;
  
  if ((dbg != (Dwarf_Debug)0x0) && (dbg->de_magic == 0xebfdebfd)) {
    uVar1 = (dbg->de_harmless_errors).dh_next_to_use;
    if ((dbg->de_harmless_errors).dh_errors == (char **)0x0) {
      (dbg->de_harmless_errors).dh_errs_count = (dbg->de_harmless_errors).dh_errs_count + 1;
    }
    else {
      out = (dbg->de_harmless_errors).dh_errors[uVar1];
      inlen = strlen(newerror);
      _dwarf_safe_strcpy(out,300,newerror,inlen);
      (dbg->de_harmless_errors).dh_errs_count = (dbg->de_harmless_errors).dh_errs_count + 1;
      (dbg->de_harmless_errors).dh_next_to_use = (uVar1 + 1) % (dbg->de_harmless_errors).dh_maxcount
      ;
      if ((dbg->de_harmless_errors).dh_next_to_use == (dbg->de_harmless_errors).dh_first) {
        (dbg->de_harmless_errors).dh_first =
             ((dbg->de_harmless_errors).dh_first + 1) % (dbg->de_harmless_errors).dh_maxcount;
      }
    }
  }
  return;
}

Assistant:

void
dwarf_insert_harmless_error(Dwarf_Debug dbg,
    char *newerror)
{
    struct Dwarf_Harmless_s *dhp = 0;
    unsigned next = 0;
    unsigned cur = 0;
    char *msgspace = 0;

    if (IS_INVALID_DBG(dbg)) {
        return;
    }
    dhp = &dbg->de_harmless_errors;
    cur = dhp->dh_next_to_use;
    if (!dhp->dh_errors) {
        dhp->dh_errs_count++;
        return;
    }
    msgspace = dhp->dh_errors[cur];
    _dwarf_safe_strcpy(msgspace,
        DW_HARMLESS_ERROR_MSG_STRING_SIZE,
        newerror,
        strlen(newerror));
    next = (cur+1) % dhp->dh_maxcount;
    dhp->dh_errs_count++;
    dhp->dh_next_to_use = next;
    if (dhp->dh_next_to_use ==  dhp->dh_first) {
        /* Array is full set full invariant. */
        dhp->dh_first = (dhp->dh_first+1) % dhp->dh_maxcount;
    }
}